

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::work_thread::demand_queue_details::
queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
::stop_service(queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
               *this)

{
  bool bVar1;
  type lock_00;
  lock_guard_t local_18;
  lock_guard_t lock;
  queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
  *this_local;
  
  lock.m_lock = (lock_t *)this;
  lock_00 = std::
            unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
            ::operator*(&(this->super_with_activity_tracking_impl_t).super_common_data_t.m_lock);
  mpsc_queue_traits::lock_guard_t::lock_guard_t(&local_18,lock_00);
  (this->super_with_activity_tracking_impl_t).super_common_data_t.m_in_service = false;
  bVar1 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::empty
                    ((deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_> *)
                     &this->super_with_activity_tracking_impl_t);
  if (bVar1) {
    mpsc_queue_traits::lock_guard_t::notify_one(&local_18);
  }
  mpsc_queue_traits::lock_guard_t::~lock_guard_t(&local_18);
  return;
}

Assistant:

void
	stop_service()
	{
		queue_traits::lock_guard_t lock{ *(this->m_lock) };

		this->m_in_service = false;
		// If the demands queue is empty then someone is waiting
		// for new demands inside pop().
		if( this->m_demands.empty() )
			lock.notify_one();
	}